

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O2

REF_STATUS ref_migrate_2d_agglomeration(REF_MIGRATE ref_migrate)

{
  REF_GRID pRVar1;
  REF_NODE pRVar2;
  REF_CELL ref_cell;
  long lVar3;
  REF_STATUS RVar4;
  uint uVar5;
  long lVar6;
  REF_INT RVar7;
  long lVar8;
  undefined8 uVar9;
  int cell;
  REF_INT RVar10;
  char *pcVar11;
  REF_INT nodes [27];
  
  pRVar1 = ref_migrate->grid;
  pRVar2 = pRVar1->node;
  lVar3 = -1;
  cell = 0;
  do {
    ref_cell = pRVar1->cell[10];
    if (ref_cell->max <= cell) {
      return 0;
    }
    RVar4 = ref_cell_nodes(ref_cell,cell,nodes);
    if (RVar4 == 0) {
      lVar6 = lVar3;
      if (((-1 < (long)nodes[0]) && (nodes[0] < pRVar2->max)) &&
         (lVar6 = pRVar2->global[nodes[0]], pRVar2->global[nodes[0]] < 0)) {
        lVar6 = lVar3;
      }
      lVar8 = lVar3;
      if (((-1 < (long)nodes[3]) && (nodes[3] < pRVar2->max)) &&
         (lVar8 = pRVar2->global[nodes[3]], pRVar2->global[nodes[3]] < 0)) {
        lVar8 = lVar3;
      }
      RVar7 = nodes[3];
      RVar10 = nodes[0];
      if (lVar8 <= lVar6) {
        RVar7 = nodes[0];
        RVar10 = nodes[3];
      }
      uVar5 = ref_migrate_2d_agglomeration_keep(ref_migrate,RVar10,RVar7);
      if (uVar5 != 0) {
        pcVar11 = "0-3";
        uVar9 = 0xf2;
LAB_001fd942:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               uVar9,"ref_migrate_2d_agglomeration",(ulong)uVar5,pcVar11);
        return uVar5;
      }
      lVar6 = lVar3;
      if (((-1 < (long)nodes[1]) && (nodes[1] < pRVar2->max)) &&
         (lVar6 = pRVar2->global[nodes[1]], pRVar2->global[nodes[1]] < 0)) {
        lVar6 = lVar3;
      }
      lVar8 = lVar3;
      if (((-1 < (long)nodes[4]) && (nodes[4] < pRVar2->max)) &&
         (lVar8 = pRVar2->global[nodes[4]], pRVar2->global[nodes[4]] < 0)) {
        lVar8 = lVar3;
      }
      RVar7 = nodes[4];
      RVar10 = nodes[1];
      if (lVar8 <= lVar6) {
        RVar7 = nodes[1];
        RVar10 = nodes[4];
      }
      uVar5 = ref_migrate_2d_agglomeration_keep(ref_migrate,RVar10,RVar7);
      if (uVar5 != 0) {
        pcVar11 = "1-4";
        uVar9 = 0xfc;
        goto LAB_001fd942;
      }
      lVar6 = lVar3;
      if (((-1 < (long)nodes[2]) && (nodes[2] < pRVar2->max)) &&
         (lVar6 = pRVar2->global[nodes[2]], pRVar2->global[nodes[2]] < 0)) {
        lVar6 = lVar3;
      }
      lVar8 = lVar3;
      if (((-1 < (long)nodes[5]) && (nodes[5] < pRVar2->max)) &&
         (lVar8 = pRVar2->global[nodes[5]], pRVar2->global[nodes[5]] < 0)) {
        lVar8 = lVar3;
      }
      RVar7 = nodes[5];
      RVar10 = nodes[2];
      if (lVar8 <= lVar6) {
        RVar7 = nodes[2];
        RVar10 = nodes[5];
      }
      uVar5 = ref_migrate_2d_agglomeration_keep(ref_migrate,RVar10,RVar7);
      if (uVar5 != 0) {
        pcVar11 = "2-5";
        uVar9 = 0x106;
        goto LAB_001fd942;
      }
    }
    cell = cell + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_migrate_2d_agglomeration(REF_MIGRATE ref_migrate) {
  REF_GRID ref_grid = ref_migrate_grid(ref_migrate);
  REF_NODE ref_node = ref_grid_node(ref_migrate_grid(ref_migrate));
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT keep, lose;

  each_ref_cell_valid_cell_with_nodes(ref_grid_pri(ref_grid), cell, nodes) {
    if (ref_node_global(ref_node, nodes[0]) <
        ref_node_global(ref_node, nodes[3])) {
      keep = nodes[0];
      lose = nodes[3];
    } else {
      keep = nodes[3];
      lose = nodes[0];
    }
    RSS(ref_migrate_2d_agglomeration_keep(ref_migrate, keep, lose), "0-3");

    if (ref_node_global(ref_node, nodes[1]) <
        ref_node_global(ref_node, nodes[4])) {
      keep = nodes[1];
      lose = nodes[4];
    } else {
      keep = nodes[4];
      lose = nodes[1];
    }
    RSS(ref_migrate_2d_agglomeration_keep(ref_migrate, keep, lose), "1-4");

    if (ref_node_global(ref_node, nodes[2]) <
        ref_node_global(ref_node, nodes[5])) {
      keep = nodes[2];
      lose = nodes[5];
    } else {
      keep = nodes[5];
      lose = nodes[2];
    }
    RSS(ref_migrate_2d_agglomeration_keep(ref_migrate, keep, lose), "2-5");
  }

  return REF_SUCCESS;
}